

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::Testi(ParameterSetupErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar14;
  long lVar13;
  
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar12);
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1428))(pEVar14,this->m_pname_invalid,1);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameteri",
                     "pname is not one of the accepted defined values.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x90ea,this->m_depth_stencil_mode_invalid);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameteri",
                     "params should have a defined constant value (based on the value of pname) and does not."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x1004,1);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameteri",
                     "called for a non-scalar parameter (pname TEXTURE_BORDER_COLOR or TEXTURE_SWIZZLE_RGBA)."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x8501,1);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameteri",
                     "the  effective target is either TEXTURE_2D_MULTISAMPLE or  TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x2802,0x8743);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameteri",
                     "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x2801,0x2700);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameteri",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a value other than NEAREST or LINEAR (no mipmap filtering is permitted)."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x813c,1);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glTextureParameteri",
                     "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a value other than zero."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x8501,1);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glTextureParameteri",
                     "texture is not the name of an existing texture object.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x813c,1);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glTextureParameteri",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to any value other than zero. "
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x813c,0xffffffff);
  bVar10 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar14,(this->super_TestCase).m_context,0x501,"glTextureParameteri",
                      "pname is TEXTURE_BASE_LEVEL and param is negative.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1428))(pEVar14,0x813d,0xffffffff);
  bVar11 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar14,(this->super_TestCase).m_context,0x501,"glTextureParameteri",
                      "pname is TEXTURE_MAX_LEVEL and param is negative.");
  return (bVar11 && (bVar10 && (bVar9 && bVar8))) &&
         ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool ParameterSetupErrorsTest::Testi()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Check that INVALID_ENUM is generated by TextureParameter* if pname is
	 not one of the accepted defined values. */
	{
		gl.textureParameteri(m_to_2D, m_pname_invalid, 1);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameteri",
								  "pname is not one of the accepted defined values.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if params
	 should have a defined constant value (based on the value of pname) and
	 does not. */
	{
		gl.textureParameteri(m_to_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, m_depth_stencil_mode_invalid);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameteri",
							 "params should have a defined constant value (based on the value of pname) and does not.");
	}
	/* Check that INVALID_ENUM is generated if TextureParameter{if} is called
	 for a non-scalar parameter (pname TEXTURE_BORDER_COLOR or
	 TEXTURE_SWIZZLE_RGBA). */
	{
		gl.textureParameteri(m_to_2D, GL_TEXTURE_BORDER_COLOR, 1);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameteri",
							 "called for a non-scalar parameter (pname TEXTURE_BORDER_COLOR or TEXTURE_SWIZZLE_RGBA).");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states. */
	{
		gl.textureParameteri(m_to_2D_ms, GL_TEXTURE_LOD_BIAS, 1);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameteri",
								  "the  effective target is either TEXTURE_2D_MULTISAMPLE or  "
								  "TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and either of pnames
	 TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE,
	 MIRRORED_REPEAT or REPEAT. */
	{
		gl.textureParameteri(m_to_rectangle, GL_TEXTURE_WRAP_S, GL_MIRROR_CLAMP_TO_EDGE);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameteri",
								  "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or "
								  "TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is
	 set to a value other than NEAREST or LINEAR (no mipmap filtering is
	 permitted). */
	{
		gl.textureParameteri(m_to_rectangle, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameteri",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a "
								  "value other than NEAREST or LINEAR (no mipmap filtering is permitted).");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a
	 value other than zero. */
	{
		gl.textureParameteri(m_to_2D_ms, GL_TEXTURE_BASE_LEVEL, 1);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameteri",
							 "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, "
							 "and pname TEXTURE_BASE_LEVEL is set to a value other than zero.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if
	 texture is not the name of an existing texture object. */
	{
		gl.textureParameteri(m_to_invalid, GL_TEXTURE_LOD_BIAS, 1);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameteri",
								  "texture is not the name of an existing texture object.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is
	 set to any value other than zero. */
	{
		gl.textureParameteri(m_to_rectangle, GL_TEXTURE_BASE_LEVEL, 1);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameteri",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to "
								  "any value other than zero. ");
	}

	/* Check that INVALID_VALUE is generated by TextureParameter* if pname is
	 TEXTURE_BASE_LEVEL or TEXTURE_MAX_LEVEL, and param or params is
	 negative. */
	{
		gl.textureParameteri(m_to_2D, GL_TEXTURE_BASE_LEVEL, -1);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureParameteri",
								  "pname is TEXTURE_BASE_LEVEL and param is negative.");

		gl.textureParameteri(m_to_2D, GL_TEXTURE_MAX_LEVEL, -1);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureParameteri",
								  "pname is TEXTURE_MAX_LEVEL and param is negative.");
	}

	return is_ok;
}